

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManFree(Fxch_Man_t *pFxchMan)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  int *piVar3;
  Hsh_VecMan_t *__ptr;
  Vec_Flt_t *__ptr_00;
  float *__ptr_01;
  Vec_Que_t *__ptr_02;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar1 = pFxchMan->vLits;
  iVar4 = pVVar1->nCap;
  pVVar5 = pVVar1->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_004c02e8;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar5 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar1->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_004c02e8:
    free(pVVar5);
  }
  free(pVVar1);
  pVVar5 = pFxchMan->vLitCount;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vLitHashKeys;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  __ptr = pFxchMan->pDivHash;
  pVVar5 = __ptr->vTable;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = __ptr->vData;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = __ptr->vMap;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  free(__ptr);
  __ptr_00 = pFxchMan->vDivWeights;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (float *)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  __ptr_02 = pFxchMan->vDivPrio;
  if (__ptr_02->pOrder != (int *)0x0) {
    free(__ptr_02->pOrder);
    __ptr_02->pOrder = (int *)0x0;
  }
  if (__ptr_02->pHeap != (int *)0x0) {
    free(__ptr_02->pHeap);
  }
  free(__ptr_02);
  pVVar1 = pFxchMan->vDivCubePairs;
  iVar4 = pVVar1->nCap;
  pVVar5 = pVVar1->pArray;
  if (iVar4 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_004c041f;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar5 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar1->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  free(pVVar5);
LAB_004c041f:
  free(pVVar1);
  pVVar5 = pFxchMan->vLevels;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vCubeFree;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vDiv;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vCubesS;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vPairs;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vCubesToUpdate;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vCubesToRemove;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = pFxchMan->vSCC;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  free(pFxchMan);
  return;
}

Assistant:

void Fxch_ManFree( Fxch_Man_t* pFxchMan )
{
    Vec_WecFree( pFxchMan->vLits );
    Vec_IntFree( pFxchMan->vLitCount );
    Vec_IntFree( pFxchMan->vLitHashKeys );
    Hsh_VecManStop( pFxchMan->pDivHash );
    Vec_FltFree( pFxchMan->vDivWeights );
    Vec_QueFree( pFxchMan->vDivPrio );
    Vec_WecFree( pFxchMan->vDivCubePairs );
    Vec_IntFree( pFxchMan->vLevels );

    Vec_IntFree( pFxchMan->vCubeFree );
    Vec_IntFree( pFxchMan->vDiv );

    Vec_IntFree( pFxchMan->vCubesS );
    Vec_IntFree( pFxchMan->vPairs );
    Vec_IntFree( pFxchMan->vCubesToUpdate );
    Vec_IntFree( pFxchMan->vCubesToRemove );
    Vec_IntFree( pFxchMan->vSCC );

    ABC_FREE( pFxchMan );
}